

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O3

Read<signed_char> __thiscall
Omega_h::mark_up_all
          (Omega_h *this,Mesh *mesh,Int low_dim,Int high_dim,Read<signed_char> *low_marked)

{
  int *piVar1;
  Alloc *pAVar2;
  Alloc *pAVar3;
  Alloc *this_00;
  LO size_in;
  undefined *puVar4;
  void *extraout_RDX;
  long lVar5;
  undefined1 uVar6;
  ulong uVar7;
  uint uVar8;
  bool bVar9;
  Read<signed_char> RVar10;
  Write<signed_char> out;
  LOs hl2l;
  type f;
  Adj l2h;
  Write<signed_char> local_148;
  Write<signed_char> local_130;
  string local_120;
  void *local_100;
  Alloc *local_f8;
  void *local_f0;
  Alloc *local_e8;
  Alloc *local_e0;
  void *local_d8;
  uint local_d0 [2];
  Alloc *local_c8;
  void *pvStack_c0;
  Alloc *local_b8;
  void *pvStack_b0;
  Alloc *local_a8;
  void *pvStack_a0;
  uint local_98 [2];
  Alloc *local_90;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  void *local_68;
  Adj local_60;
  
  Mesh::ask_down(&local_60,mesh,high_dim,low_dim);
  if (mesh->family_ == OMEGA_H_SIMPLEX) {
    switch(high_dim) {
    case 0:
      uVar8 = 1;
      goto LAB_0031299c;
    case 1:
      goto switchD_00312903_caseD_1;
    case 2:
      uVar8 = 3;
      goto LAB_00312970;
    case 3:
      bVar9 = low_dim == 3;
      if ((uint)low_dim < 3) {
        puVar4 = &DAT_0044aa8c;
        goto LAB_00312988;
      }
      break;
    default:
      goto switchD_00312903_default;
    }
  }
  else {
    switch(high_dim) {
    case 0:
      uVar8 = -(uint)(low_dim != 0) | 1;
      goto LAB_0031299c;
    case 1:
switchD_00312903_caseD_1:
      if (low_dim == 0) {
        uVar8 = 2;
        goto LAB_0031299c;
      }
      bVar9 = low_dim == 1;
      break;
    case 2:
      uVar8 = 4;
LAB_00312970:
      bVar9 = low_dim == 2;
      if ((uint)low_dim < 2) goto LAB_0031299c;
      break;
    case 3:
      bVar9 = low_dim == 3;
      if ((uint)low_dim < 3) {
        puVar4 = &DAT_0044aa98;
LAB_00312988:
        uVar8 = *(uint *)(puVar4 + (ulong)(uint)low_dim * 4);
        goto LAB_0031299c;
      }
      break;
    default:
switchD_00312903_default:
      uVar8 = 0xffffffff;
      goto LAB_0031299c;
    }
  }
  uVar8 = (uint)bVar9 * 2 - 1;
LAB_0031299c:
  local_e0 = local_60.super_Graph.ab2b.write_.shared_alloc_.alloc;
  if (((ulong)local_60.super_Graph.ab2b.write_.shared_alloc_.alloc & 7) == 0 &&
      local_60.super_Graph.ab2b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_e0 = (Alloc *)((local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count =
           (local_60.super_Graph.ab2b.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_e0;
  local_d8 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_e8 = (Alloc *)this;
  size_in = Mesh::nents(mesh,high_dim);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"");
  Write<signed_char>::Write(&local_148,size_in,'\0',&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  bVar9 = ((ulong)this_00 & 7) == 0;
  local_90 = this_00;
  if (bVar9 && this_00 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_90 = (Alloc *)(this_00->size * 8 + 1);
    }
    else {
      this_00->use_count = this_00->use_count + 1;
    }
  }
  local_88 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_80 = (low_marked->write_).shared_alloc_.alloc;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_80 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_78 = (low_marked->write_).shared_alloc_.direct_ptr;
  local_70 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_70 = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_68 = local_148.shared_alloc_.direct_ptr;
  local_c8 = local_90;
  if (((ulong)local_90 & 7) == 0 && local_90 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_c8 = (Alloc *)(local_90->size * 8 + 1);
    }
    else {
      local_90->use_count = local_90->use_count + 1;
    }
  }
  pvStack_c0 = local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
  local_b8 = local_80;
  if (((ulong)local_80 & 7) == 0 && local_80 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_b8 = (Alloc *)(local_80->size * 8 + 1);
    }
    else {
      local_80->use_count = local_80->use_count + 1;
    }
  }
  local_a8 = local_70;
  if (((ulong)local_70 & 7) == 0 && local_70 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_a8 = (Alloc *)(local_70->size * 8 + 1);
    }
    else {
      local_70->use_count = local_70->use_count + 1;
    }
  }
  pvStack_a0 = local_148.shared_alloc_.direct_ptr;
  local_d0[0] = uVar8;
  pvStack_b0 = local_78;
  local_98[0] = uVar8;
  if (0 < size_in) {
    local_120._M_dataplus._M_p._0_4_ = uVar8;
    local_120.field_2._M_allocated_capacity =
         (size_type)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr;
    local_120._M_string_length = (size_type)local_c8;
    if (((ulong)local_c8 & 7) == 0 && local_c8 != (Alloc *)0x0) {
      local_c8->use_count = local_c8->use_count + -1;
      local_120._M_string_length = local_c8->size * 8 + 1;
    }
    local_c8 = (Alloc *)0x0;
    pvStack_c0 = (void *)0x0;
    local_120.field_2._8_8_ = local_b8;
    if (((ulong)local_b8 & 7) == 0 && local_b8 != (Alloc *)0x0) {
      local_b8->use_count = local_b8->use_count + -1;
      local_120.field_2._8_8_ = local_b8->size * 8 + 1;
    }
    local_b8 = (Alloc *)0x0;
    pvStack_b0 = (void *)0x0;
    local_f0 = local_148.shared_alloc_.direct_ptr;
    local_f8 = local_a8;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      local_a8->use_count = local_a8->use_count + -1;
      local_f8 = (Alloc *)(local_a8->size * 8 + 1);
    }
    local_a8 = (Alloc *)0x0;
    pvStack_a0 = (void *)0x0;
    entering_parallel = '\0';
    lVar5 = 0;
    do {
      uVar6 = 1;
      if (0 < (int)uVar8) {
        uVar7 = 0;
        uVar6 = 1;
        do {
          if (*(char *)((long)local_78 +
                       (long)*(int *)((long)local_60.super_Graph.ab2b.write_.shared_alloc_.
                                            direct_ptr + uVar7 * 4)) == '\0') {
            uVar6 = 0;
          }
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
      *(undefined1 *)((long)local_148.shared_alloc_.direct_ptr + lVar5) = uVar6;
      lVar5 = lVar5 + 1;
      local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr =
           (void *)((long)local_60.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                   (long)(int)uVar8 * 4);
    } while (size_in != (int)lVar5);
    local_100 = local_78;
    mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)&local_120);
  }
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_d0);
  pAVar3 = local_e8;
  local_130.shared_alloc_.alloc = local_148.shared_alloc_.alloc;
  local_130.shared_alloc_.direct_ptr = local_148.shared_alloc_.direct_ptr;
  if ((((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
       local_148.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
    (local_148.shared_alloc_.alloc)->use_count = (local_148.shared_alloc_.alloc)->use_count + -1;
    local_130.shared_alloc_.alloc = (Alloc *)((local_148.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_148.shared_alloc_.alloc = (Alloc *)0x0;
  local_148.shared_alloc_.direct_ptr = (void *)0x0;
  Read<signed_char>::Read((Read<signed_char> *)local_e8,&local_130);
  pAVar2 = local_130.shared_alloc_.alloc;
  if (((ulong)local_130.shared_alloc_.alloc & 7) == 0 &&
      local_130.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_130.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_130.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  mark_up_all(Omega_h::Mesh*,int,int,Omega_h::Read<signed_char>)::$_0::~__0((__0 *)local_98);
  pAVar2 = local_148.shared_alloc_.alloc;
  if (((ulong)local_148.shared_alloc_.alloc & 7) == 0 &&
      local_148.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_148.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_148.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  if (bVar9 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
    }
  }
  Adj::~Adj(&local_60);
  RVar10.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar10.write_.shared_alloc_.alloc = pAVar3;
  return (Read<signed_char>)RVar10.write_.shared_alloc_;
}

Assistant:

Read<I8> mark_up_all(
    Mesh* mesh, Int low_dim, Int high_dim, Read<I8> low_marked) {
  auto l2h = mesh->ask_down(high_dim, low_dim);
  auto deg = element_degree(mesh->family(), high_dim, low_dim);
  auto hl2l = l2h.ab2b;
  auto nh = mesh->nents(high_dim);
  Write<I8> out(nh, 0);
  auto f = OMEGA_H_LAMBDA(LO h) {
    bool all_marked = true;
    for (Int hhl = 0; hhl < deg; ++hhl) {
      auto l = hl2l[h * deg + hhl];
      if (!low_marked[l]) all_marked = false;
    }
    out[h] = I8(all_marked);
  };
  parallel_for(nh, f, "mark_up_all");
  return out;
}